

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddGroup.c
# Opt level: O3

int zddGroupSiftingDown(DdManager *table,int x,int xHigh,Move **moves)

{
  DdSubtable *pDVar1;
  Move *pMVar2;
  Move *pMVar3;
  DdHalfWord DVar4;
  DdHalfWord y;
  uint uVar5;
  DdNode *pDVar6;
  DdHalfWord x_00;
  uint uVar7;
  
  uVar7 = table->keysZ;
  y = cuddZddNextHigh(table,x);
  do {
    if (xHigh < (int)y) {
      return 1;
    }
    pDVar1 = table->subtableZ;
    DVar4 = pDVar1[(int)y].next;
    do {
      x_00 = DVar4;
      DVar4 = pDVar1[(int)x_00].next;
    } while (pDVar1[(int)x_00].next != y);
    if ((pDVar1[x].next == x) && (pDVar1[(int)y].next == y)) {
      uVar5 = cuddZddSwapInPlace(table,x,y);
      if ((uVar5 == 0) || (pDVar6 = cuddDynamicAllocNode(table), pDVar6 == (DdNode *)0x0)) {
LAB_00926d3b:
        pMVar3 = *moves;
        while (pMVar3 != (Move *)0x0) {
          pMVar2 = pMVar3->next;
          pMVar3->y = 0;
          *(DdNode **)&pMVar3->flags = table->nextFree;
          table->nextFree = (DdNode *)*moves;
          *moves = pMVar2;
          pMVar3 = pMVar2;
        }
        return 0;
      }
      pDVar6->index = x;
      pDVar6->ref = y;
      *(undefined4 *)&pDVar6->next = 0;
      *(uint *)((long)&pDVar6->next + 4) = uVar5;
      (pDVar6->type).kids.T = (DdNode *)*moves;
      *moves = (Move *)pDVar6;
      if ((double)(int)uVar7 * table->maxGrowth < (double)(int)uVar5) {
        return 1;
      }
      if ((int)uVar5 < (int)uVar7) {
        uVar7 = uVar5;
      }
      cuddZddNextHigh(table,y);
    }
    else {
      uVar5 = zddGroupMove(table,x,y,moves);
      if (uVar5 == 0) goto LAB_00926d3b;
      if ((double)(int)uVar7 * table->maxGrowth < (double)(int)uVar5) {
        return 1;
      }
      if ((int)uVar5 < (int)uVar7) {
        uVar7 = uVar5;
      }
    }
    y = cuddZddNextHigh(table,x_00);
    x = x_00;
  } while( true );
}

Assistant:

static int
zddGroupSiftingDown(
  DdManager * table,
  int  x,
  int  xHigh,
  Move ** moves)
{
    Move *move;
    int  y;
    int  size;
    int  limitSize;
    int  gybot;


    /* Initialize R */
    limitSize = size = table->keysZ;
    y = cuddZddNextHigh(table,x);
    while (y <= xHigh) {
        /* Find bottom of y group. */
        gybot = table->subtableZ[y].next;
        while (table->subtableZ[gybot].next != (unsigned) y)
            gybot = table->subtableZ[gybot].next;

        if (table->subtableZ[x].next == (unsigned) x &&
            table->subtableZ[y].next == (unsigned) y) {
            /* x and y are self groups */
            size = cuddZddSwapInPlace(table,x,y);
#ifdef DD_DEBUG
            assert(table->subtableZ[x].next == (unsigned) x);
            assert(table->subtableZ[y].next == (unsigned) y);
#endif
            if (size == 0) goto zddGroupSiftingDownOutOfMem;

            /* Record move. */
            move = (Move *) cuddDynamicAllocNode(table);
            if (move == NULL) goto zddGroupSiftingDownOutOfMem;
            move->x = x;
            move->y = y;
            move->flags = MTR_DEFAULT;
            move->size = size;
            move->next = *moves;
            *moves = move;

#ifdef DD_DEBUG
            if (pr > 0) (void) fprintf(table->out,"zddGroupSiftingDown (2 single groups):\n");
#endif
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(1);
            if (size < limitSize) limitSize = size;
            x = y;
            y = cuddZddNextHigh(table,x);
        } else { /* Group move */
            size = zddGroupMove(table,x,y,moves);
            if (size == 0) goto zddGroupSiftingDownOutOfMem;
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(1);
            if (size < limitSize) limitSize = size;
        }
        x = gybot;
        y = cuddZddNextHigh(table,x);
    }

    return(1);

zddGroupSiftingDownOutOfMem:
    while (*moves != NULL) {
        move = (*moves)->next;
        cuddDeallocMove(table, *moves);
        *moves = move;
    }

    return(0);

}